

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::BinarySequenceExprSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == AndSequenceExpr) || (kind == IntersectSequenceExpr)) || (kind == OrSequenceExpr))
     || ((kind == ThroughoutSequenceExpr || (kind == WithinSequenceExpr)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BinarySequenceExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            return true;
        default:
            return false;
    }
}